

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::GcCompactTransientMiscBuffers(void)

{
  int *piVar1;
  int *piVar2;
  ImGuiGroupData *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  piVar2 = (GImGui->ItemFlagsStack).Data;
  if (piVar2 != (int *)0x0) {
    (pIVar4->ItemFlagsStack).Size = 0;
    (pIVar4->ItemFlagsStack).Capacity = 0;
    piVar1 = &(pIVar4->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + -1;
    (*GImAllocatorFreeFunc)(piVar2,GImAllocatorUserData);
    (pIVar4->ItemFlagsStack).Data = (int *)0x0;
  }
  pIVar3 = (pIVar4->GroupStack).Data;
  if (pIVar3 != (ImGuiGroupData *)0x0) {
    (pIVar4->GroupStack).Size = 0;
    (pIVar4->GroupStack).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    (pIVar4->GroupStack).Data = (ImGuiGroupData *)0x0;
  }
  TableGcCompactSettings();
  return;
}

Assistant:

void ImGui::GcCompactTransientMiscBuffers()
{
    ImGuiContext& g = *GImGui;
    g.ItemFlagsStack.clear();
    g.GroupStack.clear();
    TableGcCompactSettings();
}